

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O1

void __thiscall QNetworkReplyHttpImplPrivate::followRedirect(QNetworkReplyHttpImplPrivate *this)

{
  QObject *pQVar1;
  QObject *pQVar2;
  QSlotObjectBase *pQVar3;
  long in_FS_OFFSET;
  void *local_48;
  char *pcStack_40;
  QMetaTypeInterface *local_38 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QNetworkReplyPrivate).field_0x8;
  QDecompressHelper::clear(&this->decompressHelper);
  QNetworkHeadersPrivate::clearHeaders
            (&(this->super_QNetworkReplyPrivate).super_QNetworkHeadersPrivate);
  pQVar2 = (QObject *)this->managerPrivate->thread;
  if (pQVar2 != (QObject *)0x0) {
    QObject::disconnect(pQVar2,(char *)0x0,(QObject *)0x0,(char *)0x0);
  }
  local_48 = (void *)0x0;
  pcStack_40 = (char *)0x0;
  local_38[0] = &QtPrivate::QMetaTypeInterfaceWrapper<void>::metaType;
  pQVar3 = (QSlotObjectBase *)operator_new(0x18);
  (pQVar3->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar3->m_impl =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qnetworkreplyhttpimpl.cpp:1321:16),_QtPrivate::List<>,_void>
       ::impl;
  *(QNetworkReplyHttpImplPrivate **)(pQVar3 + 1) = this;
  QMetaObject::invokeMethodImpl(pQVar1,pQVar3,QueuedConnection,1,&local_48,&pcStack_40,local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyHttpImplPrivate::followRedirect()
{
    Q_Q(QNetworkReplyHttpImpl);
    Q_ASSERT(managerPrivate);

    decompressHelper.clear();
    clearHeaders();

    if (managerPrivate->thread)
        managerPrivate->thread->disconnect();

    QMetaObject::invokeMethod(
            q, [this]() { postRequest(redirectRequest); }, Qt::QueuedConnection);
}